

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int ffpnul(fitsfile *fptr,LONGLONG nulvalue,int *status)

{
  int iVar1;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int hdutype;
  tcolumn *colptr;
  fitsfile *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  fitsfile *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (*in_RDX < 1) {
    iVar1 = ffghdt(in_stack_ffffffffffffffd8,
                   (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   &in_stack_ffffffffffffffc8->HDUposition);
    if (iVar1 < 1) {
      if (in_stack_ffffffffffffffd4 == 0) {
        iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffc8,(int *)0x2555de);
        if (iVar1 == 0) {
          *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x3d0) + 0x110) = in_RSI;
          local_4 = *in_RDX;
        }
        else {
          local_4 = *in_RDX;
        }
      }
      else {
        *in_RDX = 0xe9;
        local_4 = 0xe9;
      }
    }
    else {
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffpnul(fitsfile *fptr,      /* I - FITS file pointer                */
           LONGLONG nulvalue,   /* I - null pixel value: value of BLANK */
           int *status)         /* IO - error status                    */
/*
  Define the value used to represent undefined pixels in the primary array or
  image extension. This only applies to integer image pixel (i.e. BITPIX > 0).
  This routine overrides the null pixel value given by the BLANK keyword
  if present.  Note that this routine does not write or modify the BLANK
  keyword, but instead only modifies the value temporarily in the internal
  buffer. Thus, a subsequent call to the ffrdef routine will reset the null
  value back to the BLANK  keyword value (or not defined if the keyword is not
  present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != IMAGE_HDU)
        return(*status = NOT_IMAGE);         /* not proper HDU type */

    if (fits_is_compressed_image(fptr, status)) /* ignore compressed images */
        return(*status);

    /* set pointer to the first 'column' (contains group parameters if any) */
    colptr = (fptr->Fptr)->tableptr; 

    colptr++;   /* increment to the 2nd 'column' pointer  (the image itself) */

    colptr->tnull = nulvalue;

    return(*status);
}